

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O1

void MsgHelper::destroyMsg(PipeMsg *msg)

{
  if ((byte)(msg->type - SEND_TCP_DATA) < 3) {
    free((msg->field_1).common_tcp_data.DATA);
    (msg->field_1).common_tcp_data.DATA = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void MsgHelper::destroyMsg(PipeMsg* msg)
{
	switch(msg->type)
	{
		case PIPEMSG_TYPE::SEND_TCP_DATA:
		{
			fc_free(msg->common_tcp_data.DATA);
			msg->common_tcp_data.DATA = NULL;
		}break;
		case PIPEMSG_TYPE::C2S_UDP_DATA:
		case PIPEMSG_TYPE::S2C_UDP_DATA:
		{
			fc_free(msg->common_udp_data.DATA);
			msg->common_udp_data.DATA = NULL;		
		}break;
	}
}